

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

int_type __thiscall
nlohmann::detail::input_stream_adapter::get_character(input_stream_adapter *this)

{
  int_type iVar1;
  
  iVar1 = std::streambuf::sbumpc();
  return iVar1;
}

Assistant:

std::char_traits<char>::int_type get_character() override
{
return sb.sbumpc();
}